

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.c
# Opt level: O0

void sim(void)

{
  _func_Card_ptr_ptr_unsigned_long_ptr *p_Var1;
  _func_Board_ptr_Card_ptr_ptr_unsigned_long *p_Var2;
  _func_MovePack_ptr_Board_ptr *p_Var3;
  pthread_t __th;
  Card *pCVar4;
  long lVar5;
  unsigned_long uVar6;
  MovePack *pMVar7;
  Card **totalResults_00;
  Results *results_00;
  Board *pBVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  pthread_t *__newthread;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar15 [16];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  unsigned_long cardsCount;
  MovePack *movePack;
  Card **cards;
  Results *totalResults;
  Results *results;
  Board *winningStartBoard;
  Board *startBoard;
  unsigned_long __vla_expr0;
  ulong local_10;
  unsigned_long i;
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  
  __vla_expr0 = (unsigned_long)&local_68;
  lVar5 = -(gConfig.threadCount * 8 + 0xf & 0xfffffffffffffff0);
  local_60 = (long)&local_68 + lVar5;
  startBoard = (Board *)gConfig.threadCount;
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10ae4c;
  cards = (Card **)results_create();
  local_58 = 0;
  if ((gConfig.game)->deckCreate == (_func_Card_ptr_ptr_unsigned_long_ptr *)0x0) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10ae76;
    movePack = (MovePack *)game_deckCreate(*(unsigned_long **)((long)&local_60 + lVar5));
  }
  else {
    p_Var1 = (gConfig.game)->deckCreate;
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10ae91;
    movePack = (MovePack *)(*p_Var1)(&local_58);
  }
  if ((gConfig.json & 1U) != 0) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aeaf;
    printf("{\"deck\":");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aebf;
    cards_printAsDeck(*(Card ***)((long)&local_60 + lVar5),*(uchar *)((long)&local_68 + lVar5 + 7));
  }
  pMVar7 = movePack;
  uVar6 = local_58;
  p_Var2 = (gConfig.game)->boardCreate;
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aedb;
  winningStartBoard = (*p_Var2)((Card **)pMVar7,uVar6);
  auVar16._8_56_ = extraout_var_01;
  auVar16._0_8_ = extraout_XMM1_Qa;
  auVar14._8_56_ = extraout_var;
  auVar14._0_8_ = extraout_XMM0_Qa;
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aee8;
  results = (Results *)board_dup(*(Board **)((long)&local_60 + lVar5));
  pMVar7 = movePack;
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aef5;
  free(pMVar7);
  if (((gConfig.json & 1U) == 0) && ((gConfig.printSolution & 1U) == 0)) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af26;
    pcVar11 = comma_print(*(unsigned_long *)((long)&cards + lVar5));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af37;
    printf("\x1b[35mTotal Iterations: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af47;
    pcVar11 = comma_print(*(unsigned_long *)((long)&cards + lVar5));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af58;
    printf("\x1b[35m   Maximum Depth: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af68;
    pcVar11 = comma_print(*(unsigned_long *)((long)&cards + lVar5));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af79;
    printf("\x1b[35m    Thread Count: \x1b[36m%s\x1b[0m\n",pcVar11);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10af87;
    printf("\n");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afa4;
    printf("\x1b[35m            Game: \x1b[36m%s\x1b[0m\n",(gConfig.game)->idname);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afbc;
    printf("\x1b[35m            Seed: \x1b[36m%u\x1b[0m\n",(ulong)gConfig.seed);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afca;
    printf("\n");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afd8;
    printf("\x1b[35m           Board: \x1b[0m\n");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afe3;
    board_print(*(Board **)((long)&cardsCount + lVar5),*(_Bool *)((long)&local_58 + lVar5 + 7));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10aff1;
    printf("\n");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10afff;
    printf("\x1b[35m  Starting Moves:\x1b[0m\n");
    pBVar8 = winningStartBoard;
    p_Var3 = (gConfig.game)->movePackGet;
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b017;
    cardsCount = (unsigned_long)(*p_Var3)(pBVar8);
    auVar16._8_56_ = extraout_var_02;
    auVar16._0_8_ = extraout_XMM1_Qa_00;
    auVar14._8_56_ = extraout_var_00;
    auVar14._0_8_ = extraout_XMM0_Qa_00;
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b02a;
    movePack_print(*(Board **)((long)&cardsCount + lVar5),*(MovePack **)((long)&local_58 + lVar5),
                   *(_Bool *)((long)&local_60 + lVar5 + 7));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b038;
    movePack_free(*(MovePack **)((long)&local_60 + lVar5),*(_Bool *)((long)&local_68 + lVar5 + 7));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b046;
    printf("\n");
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b054;
    printf("\x1b[37m        <<<=== \x1b[32mRUNNING\x1b[37m ===>>>\x1b[0m\n");
  }
  auVar15 = auVar16._0_16_;
  auVar13 = auVar14._0_16_;
  if (gConfig.threadCount < 2) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b165;
    cards = (Card **)depthFirstThread(*(void **)((long)&cards + lVar5));
  }
  else {
    for (local_10 = 0; pBVar8 = winningStartBoard, local_10 < gConfig.threadCount;
        local_10 = local_10 + 1) {
      __newthread = (pthread_t *)(local_60 + local_10 * 8);
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b0a2;
      iVar10 = pthread_create(__newthread,(pthread_attr_t *)0x0,depthFirstThread,pBVar8);
      uVar9 = local_10;
      if (iVar10 != 0) {
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b0c3;
        fprintf(_stderr,"Error creating thread %lu!\n",uVar9);
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b0cd;
        exit(1);
      }
    }
    local_10 = 0;
    while( true ) {
      auVar15 = auVar16._0_16_;
      auVar13 = auVar14._0_16_;
      if (gConfig.threadCount <= local_10) break;
      __th = *(pthread_t *)(local_60 + local_10 * 8);
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b10b;
      iVar10 = pthread_join(__th,&totalResults);
      uVar9 = local_10;
      results_00 = totalResults;
      totalResults_00 = cards;
      if (iVar10 != 0) {
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b12c;
        fprintf(_stderr,"Error joining thread %lu!\n",uVar9);
        *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b136;
        exit(1);
      }
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b143;
      results_add(results_00,(Results *)totalResults_00);
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b14c;
      results_free(*(Results **)((long)&uStack_70 + lVar5));
      local_10 = local_10 + 1;
    }
  }
  if ((gConfig.json & 1U) == 0) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b181;
    local_68 = comma_print(*(unsigned_long *)((long)&cards + lVar5));
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b195;
    pcVar12 = comma_print(*(unsigned_long *)((long)&cards + lVar5));
    pcVar11 = local_68;
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b1aa;
    printf("\x1b[35m       Win Count: \x1b[33m%s\x1b[35m out of \x1b[33m%s\x1b[0m\n",pcVar11,pcVar12
          );
    auVar13 = vcvtusi2sd_avx512f(auVar13,*cards);
    auVar15 = vcvtusi2sd_avx512f(auVar15,gConfig.iterationCount);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b1e0;
    printf("\x1b[35m  Win Percentage: \x1b[33m%0.4f%%\x1b[0m\n",
           (auVar13._0_8_ / auVar15._0_8_) * 100.0);
  }
  else {
    pCVar4 = *cards;
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b20c;
    printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu",(ulong)gConfig.seed,pCVar4,
           gConfig.iterationCount);
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b21a;
    printf("}\n");
  }
  if (((gConfig.printSolution & 1U) != 0) && (winningMoves != (MovePack *)0x0)) {
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b247;
    printf("\nWinning moves:\n");
    local_10 = winningMoves->movesCount - 1;
    while( true ) {
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b27a;
      move_print(*(Board **)(&stack0x000004a8 + lVar5),*(Move **)(&stack0x000004a0 + lVar5),
                 (_Bool)(&stack0x0000049f)[lVar5]);
      *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b296;
      board_moveMake(*(Board **)((long)&startBoard + lVar5),
                     *(Move **)((long)&winningStartBoard + lVar5));
      if (local_10 == 0) break;
      local_10 = local_10 - 1;
    }
    *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b2c4;
    movePack_free(*(MovePack **)((long)&local_60 + lVar5),*(_Bool *)((long)&local_68 + lVar5 + 7));
  }
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b2cd;
  board_free(*(Board **)((long)&local_60 + lVar5));
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b2d6;
  board_free(*(Board **)((long)&local_60 + lVar5));
  *(undefined8 *)((long)&uStack_70 + lVar5) = 0x10b2df;
  results_free(*(Results **)((long)&uStack_70 + lVar5));
  return;
}

Assistant:

void sim(void)
{
	unsigned long i;
	pthread_t threads[gConfig.threadCount];
	Board * startBoard;
	Board * winningStartBoard;
	Results * results;
	Results * totalResults = results_create();
	Card ** cards;
	MovePack * movePack;
	unsigned long cardsCount=0;

	if(gConfig.game->deckCreate==0)
		cards = game_deckCreate(&cardsCount);
	else
		cards = gConfig.game->deckCreate(&cardsCount);

	if(gConfig.json)
	{
		printf("{\"deck\":");
		cards_printAsDeck(cards, cardsCount);
	}

	startBoard = gConfig.game->boardCreate(cards, cardsCount);
	winningStartBoard = board_dup(startBoard);
	free(cards);
	
	// Debug section for new game
	/*board_print(startBoard, false);
	printf("====\n");
	unsigned char movesToMake[] = {0,0,1,1,0,1,1,0,0,0,0,0,0,1};
	for(i=0;i<sizeof(movesToMake);i++)
	{
		board_moveMake(startBoard, gConfig.game->movePackGet(startBoard)->moves[movesToMake[i]]);
	}
	board_print(startBoard, false);
	movePack_print(startBoard, gConfig.game->movePackGet(startBoard), false);
	exit(0);*/

	if(!gConfig.json && !gConfig.printSolution)
	{
		printf(C_MAGENTA "Total Iterations: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "   Maximum Depth: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.maxDepth));
		printf(C_MAGENTA "    Thread Count: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.threadCount));
		printf("\n");
		printf(C_MAGENTA "            Game: " C_CYAN "%s" C_RESET "\n", gConfig.game->idname);
		printf(C_MAGENTA "            Seed: " C_CYAN "%u" C_RESET "\n", gConfig.seed);
		printf("\n");
		printf(C_MAGENTA "           Board: " C_RESET "\n");
		board_print(startBoard, false);
		printf("\n");
		printf(C_MAGENTA "  Starting Moves:" C_RESET "\n");
		movePack = gConfig.game->movePackGet(startBoard);
		movePack_print(startBoard, movePack, false);
		movePack_free(movePack, true);
		printf("\n");

		printf(C_WHITE "        <<<=== " C_GREEN "RUNNING" C_WHITE " ===>>>" C_RESET "\n");
	}

	if(gConfig.threadCount>1)
	{
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_create(&threads[i], 0, depthFirstThread, startBoard)!=0)
			{
				fprintf(stderr, "Error creating thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}
		}
		
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_join(threads[i], (void **)&results)!=0)
			{
				fprintf(stderr, "Error joining thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}

			results_add(results, totalResults);
			results_free(results);
		}
	}
	else
	{
		totalResults = depthFirstThread(startBoard);
	}


	if(!gConfig.json)
	{
		printf(C_MAGENTA "       Win Count: " C_YELLOW "%s" C_MAGENTA " out of " C_YELLOW "%s" C_RESET "\n", comma_print(totalResults->winCount), comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "  Win Percentage: " C_YELLOW "%0.4f%%" C_RESET "\n", ((double)totalResults->winCount/(double)gConfig.iterationCount)*100);
	}
	else
	{
		printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu", gConfig.seed, totalResults->winCount, gConfig.iterationCount);
		printf("}\n");
	}

	if(gConfig.printSolution && winningMoves!=0)
	{
		printf("\nWinning moves:\n");
		i = winningMoves->movesCount-1;
		do
		{
			//board_print(winningStartBoard, false);
			move_print(winningStartBoard, winningMoves->moves[i], true);
			board_moveMake(winningStartBoard, winningMoves->moves[i]);
			if(i==0)
				break;

			i--;
		} while(true);

		movePack_free(winningMoves, true);
	}

	board_free(startBoard);
	board_free(winningStartBoard);
	results_free(totalResults);
}